

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::SigmoidKernel::SigmoidKernel(SigmoidKernel *this,SigmoidKernel *from)

{
  void *pvVar1;
  double dVar2;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__SigmoidKernel_003db178;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  dVar2 = from->c_;
  this->gamma_ = from->gamma_;
  this->c_ = dVar2;
  return;
}

Assistant:

SigmoidKernel::SigmoidKernel(const SigmoidKernel& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&gamma_, &from.gamma_,
    reinterpret_cast<char*>(&c_) -
    reinterpret_cast<char*>(&gamma_) + sizeof(c_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.SigmoidKernel)
}